

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QTextBlock>::insert
          (QMovableArrayOps<QTextBlock> *this,qsizetype i,qsizetype n,parameter_type t)

{
  uint uVar1;
  QTextBlock *pQVar2;
  Inserter *in_RCX;
  long lVar3;
  long in_RDX;
  QArrayDataPointer<QTextBlock> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  QTextBlock copy;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar6;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::QTextBlock((QTextBlock *)local_18,(QTextBlock *)in_RCX);
  bVar4 = *(long *)(in_RDI + 0x10) != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QTextBlock> *)0x0;
  uVar6 = CONCAT13(uVar5,(int3)in_stack_ffffffffffffff9c);
  uVar1 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QTextBlock> *)0x0);
  QArrayDataPointer<QTextBlock>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),(qsizetype)in_RCX,
             (QTextBlock **)CONCAT44(uVar6,uVar1),
             (QArrayDataPointer<QTextBlock> *)CONCAT17(uVar5,in_stack_ffffffffffffff90));
  if ((uVar6 & 0x1000000) == 0) {
    Inserter::Inserter(in_RCX,(QArrayDataPointer<QTextBlock> *)CONCAT44(uVar6,uVar1),
                       CONCAT17(uVar5,in_stack_ffffffffffffff90),in_RDI);
    Inserter::insertFill
              (in_RCX,(QTextBlock *)CONCAT44(uVar6,uVar1),CONCAT17(uVar5,in_stack_ffffffffffffff90))
    ;
    Inserter::~Inserter((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff90));
  }
  else {
    while (lVar3 = in_RDX + -1, in_RDX != 0) {
      pQVar2 = QArrayDataPointer<QTextBlock>::begin((QArrayDataPointer<QTextBlock> *)0x89166a);
      QTextBlock::QTextBlock(pQVar2 + -1,(QTextBlock *)local_18);
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -0x10;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      in_RDX = lVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }